

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O0

void la_dgemm_nnos(int m,int n,int k,double *a,int lda,double *b,int ldb,double *c,int ldc)

{
  int local_44;
  double dStack_40;
  int k_;
  double cij;
  int j_;
  int i_;
  double *b_local;
  int lda_local;
  double *a_local;
  int k_local;
  int n_local;
  int m_local;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x10e,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (b == (double *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x10f,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (c == (double *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x110,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (a == c) {
    __assert_fail("a != c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x111,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (b == c) {
    __assert_fail("b != c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x112,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (m < 0) {
    __assert_fail("m >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x113,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (n < 0) {
    __assert_fail("n >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x114,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (-1 < k) {
    if ((lda < 1) || (lda < k)) {
      __assert_fail("lda >= 1 && lda >= k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x116,
                    "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                   );
    }
    if ((0 < ldb) && (n <= ldb)) {
      if ((0 < ldc) && (n <= ldc)) {
        for (cij._4_4_ = 0; cij._4_4_ < m; cij._4_4_ = cij._4_4_ + 1) {
          for (cij._0_4_ = 0; cij._0_4_ < n; cij._0_4_ = cij._0_4_ + 1) {
            dStack_40 = 0.0;
            for (local_44 = 0; local_44 < k; local_44 = local_44 + 1) {
              dStack_40 = a[cij._4_4_ * lda + local_44] * b[local_44 * ldb + cij._0_4_] + dStack_40;
            }
            c[cij._4_4_ * ldc + cij._0_4_] = dStack_40;
          }
        }
        return;
      }
      __assert_fail("ldc >= 1 && ldc >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x118,
                    "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                   );
    }
    __assert_fail("ldb >= 1 && ldb >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x117,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  __assert_fail("k >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x115,
                "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgemm_nnos(
        int m, int n, int k,
        const double *a, int lda,
        const double *b, int ldb,
        double *c, int ldc)
{
    assert(a);
    assert(b);
    assert(c);
    assert(a != c);
    assert(b != c);
    assert(m >= 0);
    assert(n >= 0);
    assert(k >= 0);
    assert(lda >= 1 && lda >= k);
    assert(ldb >= 1 && ldb >= n);
    assert(ldc >= 1 && ldc >= n);

    for (int i_ = 0; i_ < m; i_++) {
        for (int j_ = 0; j_ < n; j_++) {
            double cij = 0.0;
            for (int k_ = 0; k_ < k; k_++) {
                cij += a[i_ * lda + k_] * b[k_ * ldb + j_];
            }
            c[i_ * ldc + j_] = cij;
        }
    }
}